

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

AliasRet aa_xref(jit_State *J,IRIns *refa,IRIns *xa,IRIns *xb)

{
  byte bVar1;
  byte bVar2;
  AliasRet AVar3;
  IRIns *pIVar4;
  IRIns *pIVar5;
  long lVar6;
  long lVar7;
  IRIns *ir;
  
  pIVar4 = (J->cur).ir;
  ir = pIVar4 + (xb->field_0).op1;
  if ((ir == refa) && ((((xb->field_1).t.irt ^ (xa->field_1).t.irt) & 0x1f) == 0)) {
    return ALIAS_MUST;
  }
  if (((refa->field_1).o == ')') && (lVar6 = (long)(short)(refa->field_0).op2, -1 < lVar6)) {
    refa = pIVar4 + (refa->field_0).op1;
    if (*(char *)((long)pIVar4 + lVar6 * 8 + 5) == '\x1d') {
      lVar6 = *(long *)&pIVar4[lVar6 + 1].i;
    }
    else {
      lVar6 = (long)pIVar4[lVar6].i;
    }
  }
  else {
    lVar6 = 0;
  }
  if (((ir->field_1).o == ')') && (lVar7 = (long)(short)(ir->field_0).op2, -1 < lVar7)) {
    ir = pIVar4 + (ir->field_0).op1;
    if (*(char *)((long)pIVar4 + lVar7 * 8 + 5) == '\x1d') {
      lVar7 = *(long *)&pIVar4[lVar7 + 1].i;
    }
    else {
      lVar7 = (long)pIVar4[lVar7].i;
    }
  }
  else {
    lVar7 = 0;
  }
  if (((refa->field_1).o == '\x19') && ((ir->field_1).o == '\x19')) {
    lVar7 = (lVar7 + (long)ir[1]) - (long)refa[1];
    ir = refa;
  }
  bVar1 = (byte)(xa->field_0).ot;
  if (refa == ir) {
    bVar2 = (byte)(xb->field_0).ot;
    if (lVar6 == lVar7) {
      if (("\x04\x04\x04\b\b\x04\b\b\b\b\b\b\b\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"[bVar1] ==
           "\x04\x04\x04\b\b\x04\b\b\b\b\b\b\b\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"[bVar2]) &&
         ((byte)((bVar2 & 0x1f) - 0xf) < 0xfe != (byte)((bVar1 & 0x1f) - 0xd) < 2)) {
        return ALIAS_MUST;
      }
    }
    else {
      if ((long)((ulong)"\x04\x04\x04\b\b\x04\b\b\b\b\b\b\b\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"
                        [bVar1] + lVar6) <= lVar7) {
        return ALIAS_NO;
      }
      if ((long)(lVar7 + (ulong)"\x04\x04\x04\b\b\x04\b\b\b\b\b\b\b\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"
                                [bVar2]) <= lVar6) {
        return ALIAS_NO;
      }
    }
  }
  else {
    bVar2 = (byte)(xb->field_0).ot;
    if (((bVar2 ^ bVar1) & 0x1f) != 0) {
      if (7 < (bVar1 & 0x1f) - 0xf) {
        return ALIAS_NO;
      }
      if ((bVar2 - 0xf ^ bVar1 - 0xf) != 1) {
        return ALIAS_NO;
      }
    }
    pIVar4 = aa_findcnew(J,refa);
    pIVar5 = aa_findcnew(J,ir);
    if (pIVar4 != pIVar5) {
      if ((pIVar4 != (IRIns *)0x0) && (pIVar5 != (IRIns *)0x0)) {
        return ALIAS_NO;
      }
      if (pIVar5 != (IRIns *)0x0) {
        pIVar4 = pIVar5;
        ir = refa;
      }
      AVar3 = aa_escape(J,pIVar4,ir);
      return AVar3;
    }
  }
  return ALIAS_MAY;
}

Assistant:

static AliasRet aa_xref(jit_State *J, IRIns *refa, IRIns *xa, IRIns *xb)
{
  ptrdiff_t ofsa = 0, ofsb = 0;
  IRIns *refb = IR(xb->op1);
  IRIns *basea = refa, *baseb = refb;
  if (refa == refb && irt_sametype(xa->t, xb->t))
    return ALIAS_MUST;  /* Shortcut for same refs with identical type. */
  /* Offset-based disambiguation. */
  if (refa->o == IR_ADD && irref_isk(refa->op2)) {
    IRIns *irk = IR(refa->op2);
    basea = IR(refa->op1);
    ofsa = (LJ_64 && irk->o == IR_KINT64) ? (ptrdiff_t)ir_k64(irk)->u64 :
					    (ptrdiff_t)irk->i;
  }
  if (refb->o == IR_ADD && irref_isk(refb->op2)) {
    IRIns *irk = IR(refb->op2);
    baseb = IR(refb->op1);
    ofsb = (LJ_64 && irk->o == IR_KINT64) ? (ptrdiff_t)ir_k64(irk)->u64 :
					    (ptrdiff_t)irk->i;
  }
  /* Treat constified pointers like base vs. base+offset. */
  if (basea->o == IR_KPTR && baseb->o == IR_KPTR) {
    ofsb += (char *)ir_kptr(baseb) - (char *)ir_kptr(basea);
    baseb = basea;
  }
  /* This implements (very) strict aliasing rules.
  ** Different types do NOT alias, except for differences in signedness.
  ** Type punning through unions is allowed (but forces a reload).
  */
  if (basea == baseb) {
    ptrdiff_t sza = irt_size(xa->t), szb = irt_size(xb->t);
    if (ofsa == ofsb) {
      if (sza == szb && irt_isfp(xa->t) == irt_isfp(xb->t))
	return ALIAS_MUST;  /* Same-sized, same-kind. May need to convert. */
    } else if (ofsa + sza <= ofsb || ofsb + szb <= ofsa) {
      return ALIAS_NO;  /* Non-overlapping base+-o1 vs. base+-o2. */
    }
    /* NYI: extract, extend or reinterpret bits (int <-> fp). */
    return ALIAS_MAY;  /* Overlapping or type punning: force reload. */
  }
  if (!irt_sametype(xa->t, xb->t) &&
      !(irt_typerange(xa->t, IRT_I8, IRT_U64) &&
	((xa->t.irt - IRT_I8) ^ (xb->t.irt - IRT_I8)) == 1))
    return ALIAS_NO;
  /* NYI: structural disambiguation. */
  return aa_cnew(J, basea, baseb);  /* Try to disambiguate allocations. */
}